

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionTest.cpp
# Opt level: O0

void __thiscall
AssertionTest_assertGeHandlerShouldBeCalled_Test::AssertionTest_assertGeHandlerShouldBeCalled_Test
          (AssertionTest_assertGeHandlerShouldBeCalled_Test *this)

{
  AssertionTest_assertGeHandlerShouldBeCalled_Test *this_local;
  
  AssertionTest::AssertionTest(&this->super_AssertionTest);
  (this->super_AssertionTest).super_Test._vptr_Test =
       (_func_int **)&PTR__AssertionTest_assertGeHandlerShouldBeCalled_Test_001d2120;
  return;
}

Assistant:

TEST_F(AssertionTest, assertGeHandlerShouldBeCalled)
{
    std::int32_t a = 0;
    std::int32_t b = 1;
    CPP_ASSERT_GE(a, b);
    EXPECT_EQ(1, assertionHandlerCounter_);

    SET_EXPECTED_MSG(a, b);
    CPP_ASSERT_GE(a, b, EXPECTED_TEST_MSG(a,b));
    EXPECT_EQ(2, assertionHandlerCounter_);
}